

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall
FIX::SocketMonitor::processPollList
          (SocketMonitor *this,Strategy *strategy,pollfd *pfds,uint pfds_size)

{
  uint local_28;
  uint i;
  uint pfds_size_local;
  pollfd *pfds_local;
  Strategy *strategy_local;
  SocketMonitor *this_local;
  
  for (local_28 = 0; local_28 < pfds_size; local_28 = local_28 + 1) {
    if (((pfds[local_28].revents & 1U) != 0) || ((pfds[local_28].revents & 2U) != 0)) {
      processRead(this,strategy,pfds[local_28].fd);
    }
    if ((pfds[local_28].revents & 4U) != 0) {
      processWrite(this,strategy,pfds[local_28].fd);
    }
    if ((pfds[local_28].revents & 8U) != 0) {
      processError(this,strategy,pfds[local_28].fd);
    }
  }
  return;
}

Assistant:

void SocketMonitor::processPollList(Strategy &strategy, struct pollfd *pfds, unsigned pfds_size) {
  for (unsigned i = 0; i < pfds_size; ++i) {
    if ((pfds[i].revents & POLLIN) || (pfds[i].revents & POLLPRI)) {
      processRead(strategy, pfds[i].fd);
    }

    if ((pfds[i].revents & POLLOUT)) {
      processWrite(strategy, pfds[i].fd);
    }
    if ((pfds[i].revents & POLLERR)) {
      processError(strategy, pfds[i].fd);
    }
  }
}